

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymdeltat.c
# Opt level: O0

void YM_DELTAT_ADPCM_Init
               (YM_DELTAT *DELTAT,int emulation_mode,int portshift,INT32 *output_ptr,
               int output_range)

{
  int output_range_local;
  INT32 *output_ptr_local;
  int portshift_local;
  int emulation_mode_local;
  YM_DELTAT *DELTAT_local;
  
  DELTAT->emulation_mode = (UINT8)emulation_mode;
  if (DELTAT->emulation_mode == '\x01') {
    DELTAT->portstate = ' ';
    DELTAT->control2 = '\x01';
  }
  else {
    DELTAT->portstate = '\0';
    DELTAT->control2 = '\0';
  }
  DELTAT->portshift_base = (UINT8)portshift;
  DELTAT->output_pointer = output_ptr;
  DELTAT->output_range = output_range;
  DELTAT->now_portshift = DELTAT->portshift_base - "\x03"[(int)(DELTAT->control2 & 3)];
  DELTAT->address_mask = (0x10000 << (DELTAT->now_portshift + 1 & 0x1f)) - 1;
  return;
}

Assistant:

void YM_DELTAT_ADPCM_Init(YM_DELTAT *DELTAT,int emulation_mode,int portshift,INT32* output_ptr,int output_range)
{
	DELTAT->emulation_mode = (UINT8)emulation_mode;
	if (DELTAT->emulation_mode == YM_DELTAT_EMULATION_MODE_YM2610)
	{
		DELTAT->portstate = 0x20;
		DELTAT->control2  = 0x01;
	}
	else
	{
		DELTAT->portstate = 0x00;
		DELTAT->control2  = 0x00;	/* default setting depends on the emulation mode. MSX demo called "facdemo_4" doesn't setup control2 register at all and still works */
	}
	DELTAT->portshift_base = (UINT8)portshift;
	DELTAT->output_pointer = output_ptr;
	DELTAT->output_range = output_range;
	DELTAT->now_portshift = DELTAT->portshift_base - dram_rightshift[DELTAT->control2 & 3];
	DELTAT->address_mask = (0x10000 << (DELTAT->now_portshift + 1)) - 1;
}